

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O3

void cf2_glyphpath_hintPoint
               (CF2_GlyphPath glyphpath,CF2_HintMap hintmap,FT_Vector *ppt,CF2_F16Dot16 x,
               CF2_F16Dot16 y)

{
  CF2_Font pCVar1;
  CF2_F16Dot16 CVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar3 = (long)x * (long)glyphpath->scaleX;
  lVar5 = (long)glyphpath->scaleC * (long)y;
  CVar2 = cf2_hintmap_map(hintmap,y);
  pCVar1 = glyphpath->font;
  lVar5 = (long)((int)((ulong)(lVar5 + 0x8000 + (lVar5 >> 0x3f)) >> 0x10) +
                (int)((ulong)(lVar3 + 0x8000 + (lVar3 >> 0x3f)) >> 0x10));
  lVar3 = (pCVar1->outerTransform).a * lVar5;
  lVar4 = (long)(pCVar1->outerTransform).c * (long)CVar2;
  ppt->x = (long)((int)((ulong)(lVar3 + 0x8000 + (lVar3 >> 0x3f)) >> 0x10) +
                 (int)((ulong)(lVar4 + 0x8000 + (lVar4 >> 0x3f)) >> 0x10) +
                 (int)(glyphpath->fractionalTranslation).x);
  lVar5 = (pCVar1->outerTransform).b * lVar5;
  lVar3 = (long)(pCVar1->outerTransform).d * (long)CVar2;
  ppt->y = (long)((int)((ulong)(lVar3 + 0x8000 + (lVar3 >> 0x3f)) >> 0x10) +
                 (int)((ulong)(lVar5 + 0x8000 + (lVar5 >> 0x3f)) >> 0x10) +
                 (int)(glyphpath->fractionalTranslation).y);
  return;
}

Assistant:

static void
  cf2_glyphpath_hintPoint( CF2_GlyphPath  glyphpath,
                           CF2_HintMap    hintmap,
                           FT_Vector*     ppt,
                           CF2_Fixed      x,
                           CF2_Fixed      y )
  {
    FT_Vector  pt;   /* hinted point in upright DS */


    pt.x = ADD_INT32( FT_MulFix( glyphpath->scaleX, x ),
                      FT_MulFix( glyphpath->scaleC, y ) );
    pt.y = cf2_hintmap_map( hintmap, y );

    ppt->x = ADD_INT32(
               FT_MulFix( glyphpath->font->outerTransform.a, pt.x ),
               ADD_INT32(
                 FT_MulFix( glyphpath->font->outerTransform.c, pt.y ),
                 glyphpath->fractionalTranslation.x ) );
    ppt->y = ADD_INT32(
               FT_MulFix( glyphpath->font->outerTransform.b, pt.x ),
               ADD_INT32(
                 FT_MulFix( glyphpath->font->outerTransform.d, pt.y ),
                 glyphpath->fractionalTranslation.y ) );
  }